

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O0

ReadWrite __thiscall SCSI::Target::CommandState::read_write_specs(CommandState *this)

{
  ReadWrite RVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  size_type sVar4;
  CommandState *this_local;
  ReadWrite specs;
  
  uVar3 = address(this);
  uVar2 = number_of_blocks(this);
  this_local._4_4_ = (uint)uVar2;
  if (this_local._4_4_ == 0) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this->data_);
    if (sVar4 == 6) {
      this_local._4_4_ = 0x100;
    }
  }
  RVar1.number_of_blocks = this_local._4_4_;
  RVar1.address = uVar3;
  return RVar1;
}

Assistant:

CommandState::ReadWrite CommandState::read_write_specs() const {
	ReadWrite specs;

	specs.address = address();
	specs.number_of_blocks = number_of_blocks();
	if(!specs.number_of_blocks && (data_.size() == 6)) {
		specs.number_of_blocks = 256;
	}

	return specs;
}